

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O0

ion_err_t oadict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                     ion_dict_cursor_t **cursor)

{
  ion_oadict_cursor_t *piVar1;
  ion_key_t pvVar2;
  ion_err_t iVar3;
  ion_dict_cursor_t *piVar4;
  ion_predicate_t *piVar5;
  void *pvVar6;
  ion_err_t err_1;
  ion_hashmap_t *hash_map_1;
  ion_oadict_cursor_t *oadict_cursor_2;
  ion_err_t err;
  ion_hashmap_t *hash_map;
  ion_oadict_cursor_t *oadict_cursor_1;
  ion_oadict_cursor_t *oadict_cursor;
  ion_dict_cursor_t **ppiStack_28;
  int location;
  ion_dict_cursor_t **cursor_local;
  ion_predicate_t *predicate_local;
  ion_dictionary_t *dictionary_local;
  
  ppiStack_28 = cursor;
  cursor_local = (ion_dict_cursor_t **)predicate;
  predicate_local = (ion_predicate_t *)dictionary;
  piVar4 = (ion_dict_cursor_t *)malloc(0x38);
  *ppiStack_28 = piVar4;
  if (piVar4 == (ion_dict_cursor_t *)0x0) {
    dictionary_local._7_1_ = '\x06';
  }
  else {
    (*ppiStack_28)->dictionary = (ion_dictionary_t *)predicate_local;
    (*ppiStack_28)->status = '\x03';
    (*ppiStack_28)->destroy = oadict_destroy_cursor;
    (*ppiStack_28)->next = oadict_next;
    piVar5 = (ion_predicate_t *)malloc(0x20);
    (*ppiStack_28)->predicate = piVar5;
    (*ppiStack_28)->predicate->type = *(ion_predicate_type_t *)cursor_local;
    (*ppiStack_28)->predicate->destroy = (_func_void_ion_predicate_t_ptr_ptr *)cursor_local[3];
    switch(*(undefined1 *)cursor_local) {
    case 0:
      pvVar6 = malloc((long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
      ((*ppiStack_28)->predicate->statement).range.lower_bound = pvVar6;
      if (pvVar6 == (void *)0x0) {
        free((*ppiStack_28)->predicate);
        free(*ppiStack_28);
        dictionary_local._7_1_ = '\x06';
      }
      else {
        memcpy(((*ppiStack_28)->predicate->statement).range.lower_bound,cursor_local[1],
               (long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
        oadict_cursor._4_4_ = 0xffffffff;
        iVar3 = oah_find_item_loc((ion_hashmap_t *)(predicate_local->statement).range.lower_bound,
                                  ((*ppiStack_28)->predicate->statement).range.lower_bound,
                                  (int *)((long)&oadict_cursor + 4));
        if (iVar3 == '\x01') {
          (*ppiStack_28)->status = '\x01';
          dictionary_local._7_1_ = '\0';
        }
        else {
          (*ppiStack_28)->status = '\x02';
          piVar4 = *ppiStack_28;
          *(undefined4 *)(piVar4 + 1) = oadict_cursor._4_4_;
          *(undefined4 *)&piVar4[1].field_0x4 = oadict_cursor._4_4_;
          dictionary_local._7_1_ = '\0';
        }
      }
      break;
    case 1:
      pvVar6 = malloc((long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
      ((*ppiStack_28)->predicate->statement).range.lower_bound = pvVar6;
      if (pvVar6 == (void *)0x0) {
        free((*ppiStack_28)->predicate);
        free(*ppiStack_28);
        dictionary_local._7_1_ = '\x06';
      }
      else {
        memcpy(((*ppiStack_28)->predicate->statement).range.lower_bound,cursor_local[1],
               (long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
        pvVar6 = malloc((long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
        ((*ppiStack_28)->predicate->statement).range.upper_bound = pvVar6;
        if (pvVar6 == (void *)0x0) {
          free(((*ppiStack_28)->predicate->statement).range.lower_bound);
          free((*ppiStack_28)->predicate);
          free(*ppiStack_28);
          dictionary_local._7_1_ = '\x06';
        }
        else {
          memcpy(((*ppiStack_28)->predicate->statement).range.upper_bound,cursor_local[2],
                 (long)*(int *)((long)(predicate_local->statement).range.lower_bound + 4));
          piVar1 = (ion_oadict_cursor_t *)*ppiStack_28;
          pvVar2 = (predicate_local->statement).range.lower_bound;
          (*ppiStack_28)->status = '\x02';
          piVar1->first = *(int *)((long)pvVar2 + 0x20) + -1;
          piVar1->current = -1;
          iVar3 = oadict_scan(piVar1);
          if (iVar3 == '\x01') {
            (*ppiStack_28)->status = '\x03';
          }
          dictionary_local._7_1_ = '\0';
        }
      }
      break;
    case 2:
      piVar1 = (ion_oadict_cursor_t *)*ppiStack_28;
      pvVar2 = (predicate_local->statement).range.lower_bound;
      (*ppiStack_28)->status = '\x02';
      piVar1->first = *(int *)((long)pvVar2 + 0x20) + -1;
      piVar1->current = -1;
      iVar3 = oadict_scan(piVar1);
      if (iVar3 == '\x01') {
        (*ppiStack_28)->status = '\x03';
      }
      dictionary_local._7_1_ = '\0';
      break;
    case 3:
      dictionary_local._7_1_ = '\0';
      break;
    default:
      dictionary_local._7_1_ = '\x05';
    }
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
oadict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	/* allocate memory for cursor */
	if ((*cursor = malloc(sizeof(ion_oadict_cursor_t))) == NULL) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary			= dictionary;
	(*cursor)->status				= cs_cursor_uninitialized;

	/* bind destroy method for cursor */
	(*cursor)->destroy				= oadict_destroy_cursor;

	/* bind correct next function */
	(*cursor)->next					= oadict_next;	/* this will use the correct value */

	/* allocate predicate */
	(*cursor)->predicate			= malloc(sizeof(ion_predicate_t));
	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	/* based on the type of predicate that is being used, need to create the correct cursor */
	switch (predicate->type) {
		case predicate_equality: {
			/* as this is an equality, need to malloc for key as well */
			if (((*cursor)->predicate->statement.equality.equality_value = malloc((((ion_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.equality.equality_value, predicate->statement.equality.equality_value, ((((ion_hashmap_t *) dictionary->instance)->super.record.key_size)));

			/* find the location of the first element as this is a straight equality */
			int location = cs_invalid_index;

			if (oah_find_item_loc((ion_hashmap_t *) dictionary->instance, (*cursor)->predicate->statement.equality.equality_value, &location) == err_item_not_found) {
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;

				/* cast to specific instance type for conveniences of setup */
				ion_oadict_cursor_t *oadict_cursor = (ion_oadict_cursor_t *) (*cursor);

				/* the cursor is ready to be consumed */
				oadict_cursor->first	= location;

				oadict_cursor->current	= location;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			if (((*cursor)->predicate->statement.range.lower_bound = malloc((((ion_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, (((ion_hashmap_t *) dictionary->instance)->super.record.key_size));

			/* as this is a range, need to malloc upper bound key */
			if (((*cursor)->predicate->statement.range.upper_bound = malloc((((ion_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, (((ion_hashmap_t *) dictionary->instance)->super.record.key_size));

			ion_oadict_cursor_t *oadict_cursor	= (ion_oadict_cursor_t *) (*cursor);
			ion_hashmap_t		*hash_map		= ((ion_hashmap_t *) dictionary->instance);

			(*cursor)->status		= cs_cursor_initialized;
			oadict_cursor->first	= (hash_map->map_size) - 1;
			oadict_cursor->current	= -1;

			ion_err_t err = oadict_scan(oadict_cursor);

			if (cs_end_of_results == err) {
				(*cursor)->status = cs_cursor_uninitialized;
			}

			return err_ok;
			break;
		}

		case predicate_all_records: {
			ion_oadict_cursor_t *oadict_cursor	= (ion_oadict_cursor_t *) (*cursor);
			ion_hashmap_t		*hash_map		= ((ion_hashmap_t *) dictionary->instance);

			(*cursor)->status		= cs_cursor_initialized;
			oadict_cursor->first	= (hash_map->map_size) - 1;
			oadict_cursor->current	= -1;

			ion_err_t err = oadict_scan(oadict_cursor);

			if (cs_end_of_results == err) {
				(*cursor)->status = cs_cursor_uninitialized;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;	/* * Invalid predicate supplied */
			break;
		}
	}

	return err_ok;
}